

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

QSize __thiscall QCalendarWidget::minimumSizeHint(QCalendarWidget *this)

{
  bool bVar1;
  int iVar2;
  HorizontalHeaderFormat HVar3;
  VerticalHeaderFormat VVar4;
  int iVar5;
  QCalendarWidgetPrivate *pQVar6;
  QStyle *pQVar7;
  int *piVar8;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QLatin1StringView latin1;
  int buttonDecoMargin;
  int i_3;
  int headerW;
  int headerH;
  int i_2;
  int j;
  int i_1;
  int i;
  int marginH;
  int cols;
  int rows;
  int end;
  QCalendarWidgetPrivate *d;
  QMargins cm;
  QString monthName;
  int monthW;
  QFontMetrics fm_3;
  QSize headerSize;
  QFontMetrics fm;
  QFontMetrics fm_2;
  QFontMetrics fm_1;
  int h;
  int w;
  QStyleOption option;
  QWidget *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  int in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  QCalendarModel *in_stack_fffffffffffffd58;
  QCalendarModel *this_00;
  undefined1 in_stack_fffffffffffffd70 [16];
  undefined8 uVar10;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  int local_25c;
  int local_258;
  QSize local_23c;
  int local_224;
  undefined1 *local_220;
  undefined1 local_200 [16];
  QFontMetrics local_1f0 [36];
  undefined1 local_1cc [16];
  undefined8 local_1bc;
  undefined1 local_1b4 [16];
  int local_1a4;
  QLocale local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  int local_17c;
  undefined1 *local_178;
  undefined8 local_16c;
  undefined8 local_164;
  undefined8 local_15c;
  undefined1 *local_154;
  int local_14c;
  int local_148;
  int local_144;
  undefined1 local_140 [28];
  int local_124;
  undefined1 *local_120;
  int local_114;
  undefined1 local_110 [28];
  int local_f4;
  undefined1 *local_f0;
  int local_e4;
  undefined1 local_e0 [28];
  int local_c4;
  undefined1 *local_c0;
  int local_b8;
  int local_b4;
  QSize local_b0;
  QFont local_98 [32];
  QFont local_78 [32];
  QFont local_58 [16];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QCalendarWidget *)0x51e656);
  bVar1 = QSize::isValid((QSize *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  if (bVar1) {
    local_b0 = pQVar6->cachedSizeHint;
  }
  else {
    QWidget::ensurePolished(in_RDI);
    local_b4 = 0;
    local_b8 = 0;
    local_258 = 7;
    local_25c = 8;
    memset(local_48,0xaa,0x40);
    QStyleOption::QStyleOption
              ((QStyleOption *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,
               in_stack_fffffffffffffd50);
    QStyleOption::initFrom
              ((QStyleOption *)in_stack_fffffffffffffd58,
               (QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    pQVar7 = QWidget::style(in_stack_fffffffffffffd38);
    iVar2 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x41,local_48,in_RDI);
    iVar2 = (iVar2 + 1) * 2;
    HVar3 = horizontalHeaderFormat
                      ((QCalendarWidget *)
                       CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    if (HVar3 == NoHorizontalHeader) {
      local_258 = 6;
    }
    else {
      for (local_264 = 1; local_264 < 8; local_264 = local_264 + 1) {
        local_c0 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivate::QCalendarModel::formatForCell
                  ((QCalendarModel *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   in_stack_fffffffffffffd70._12_4_,in_stack_fffffffffffffd70._8_4_);
        QTextCharFormat::font();
        QFontMetrics::QFontMetrics((QFontMetrics *)&local_c0,local_58);
        QFont::~QFont(local_58);
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x51e7d2);
        this_00 = pQVar6->m_model;
        QtPrivate::QCalendarModel::dayOfWeekForColumn(pQVar6->m_model,local_264);
        QtPrivate::QCalendarModel::dayName
                  (this_00,(DayOfWeek)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        local_c4 = QFontMetrics::horizontalAdvance((QString *)&local_c0,(int)local_e0);
        local_c4 = local_c4 + iVar2;
        piVar8 = qMax<int>(&local_b4,&local_c4);
        local_b4 = *piVar8;
        QString::~QString((QString *)0x51e85c);
        local_e4 = QFontMetrics::height();
        piVar8 = qMax<int>(&local_b8,&local_e4);
        local_b8 = *piVar8;
        QFontMetrics::~QFontMetrics((QFontMetrics *)&local_c0);
      }
    }
    VVar4 = verticalHeaderFormat
                      ((QCalendarWidget *)
                       CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    uVar10 = in_stack_fffffffffffffd70._8_8_;
    if (VVar4 == NoVerticalHeader) {
      local_25c = 7;
    }
    else {
      for (local_268 = 1; uVar10 = in_stack_fffffffffffffd70._8_8_, local_268 < 7;
          local_268 = local_268 + 1) {
        local_f0 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivate::QCalendarModel::formatForCell
                  ((QCalendarModel *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   in_stack_fffffffffffffd70._12_4_,in_stack_fffffffffffffd70._8_4_);
        QTextCharFormat::font();
        QFontMetrics::QFontMetrics((QFontMetrics *)&local_f0,local_78);
        QFont::~QFont(local_78);
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x51e94e);
        for (local_26c = 1; local_26c < 0x35; local_26c = local_26c + 1) {
          QString::number((int)local_110,local_26c);
          local_f4 = QFontMetrics::horizontalAdvance((QString *)&local_f0,(int)local_110);
          local_f4 = local_f4 + iVar2;
          piVar8 = qMax<int>(&local_b4,&local_f4);
          local_b4 = *piVar8;
          QString::~QString((QString *)0x51e9c6);
        }
        local_114 = QFontMetrics::height();
        piVar8 = qMax<int>(&local_b8,&local_114);
        local_b8 = *piVar8;
        QFontMetrics::~QFontMetrics((QFontMetrics *)&local_f0);
      }
    }
    local_120 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::QCalendarModel::formatForCell
              ((QCalendarModel *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (int)((ulong)uVar10 >> 0x20),(int)uVar10);
    QTextCharFormat::font();
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_120,local_98);
    QFont::~QFont(local_98);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x51ea97);
    for (local_270 = 1; local_270 < 0x36; local_270 = local_270 + 1) {
      QString::number((int)local_140,local_270);
      local_124 = QFontMetrics::horizontalAdvance((QString *)&local_120,(int)local_140);
      local_124 = local_124 + iVar2;
      piVar8 = qMax<int>(&local_b4,&local_124);
      local_b4 = *piVar8;
      QString::~QString((QString *)0x51eb13);
      local_144 = QFontMetrics::height();
      piVar8 = qMax<int>(&local_b8,&local_144);
      local_b8 = *piVar8;
    }
    bVar1 = QTableView::showGrid
                      ((QTableView *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    if (bVar1) {
      local_b4 = local_b4 + 1;
      local_b8 = local_b8 + 1;
    }
    local_b4 = local_b4 + 1;
    QTableView::verticalHeader
              ((QTableView *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    local_148 = QHeaderView::minimumSectionSize
                          ((QHeaderView *)
                           CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    piVar8 = qMax<int>(&local_b8,&local_148);
    local_b8 = *piVar8;
    QTableView::horizontalHeader
              ((QTableView *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    local_14c = QHeaderView::minimumSectionSize
                          ((QHeaderView *)
                           CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    piVar8 = qMax<int>(&local_b4,&local_14c);
    local_b4 = *piVar8;
    local_154 = &DAT_aaaaaaaaaaaaaaaa;
    QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                 (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(int)in_stack_fffffffffffffd38);
    if ((pQVar6->navBarVisible & 1U) != 0) {
      local_15c = (**(code **)(*(long *)pQVar6->navBarBackground + 0x70))();
      QSize::height((QSize *)0x51ec74);
      local_164 = (**(code **)(*(long *)&(pQVar6->prevMonth->super_QAbstractButton).super_QWidget +
                              0x70))();
      QSize::width((QSize *)0x51eca7);
      local_16c = (**(code **)(*(long *)&(pQVar6->nextMonth->super_QAbstractButton).super_QWidget +
                              0x70))();
      QSize::width((QSize *)0x51ecd6);
      local_178 = &DAT_aaaaaaaaaaaaaaaa;
      QWidget::fontMetrics(in_stack_fffffffffffffd38);
      local_17c = 0;
      for (iVar2 = 1; iVar2 < 0xc; iVar2 = iVar2 + 1) {
        local_198 = &DAT_aaaaaaaaaaaaaaaa;
        local_190 = &DAT_aaaaaaaaaaaaaaaa;
        local_188 = &DAT_aaaaaaaaaaaaaaaa;
        in_stack_fffffffffffffd58 = pQVar6->m_model;
        QWidget::locale((QWidget *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        QtPrivate::QCalendarModel::monthName
                  ((QCalendarModel *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (QLocale *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                   (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        QLocale::~QLocale(&local_1a0);
        auVar9 = QFontMetrics::boundingRect((QString *)&local_178);
        local_1b4 = auVar9;
        local_1a4 = QRect::width((QRect *)in_stack_fffffffffffffd38);
        piVar8 = qMax<int>(&local_17c,&local_1a4);
        local_17c = *piVar8;
        QString::~QString((QString *)0x51ee03);
      }
      local_1bc = (**(code **)(*(long *)&(pQVar6->monthButton->super_QToolButton).
                                         super_QAbstractButton.super_QWidget + 0x70))();
      iVar2 = QSize::width((QSize *)0x51ee3a);
      QAbstractButton::text
                ((QAbstractButton *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      local_1cc = QFontMetrics::boundingRect((QString *)&local_178);
      iVar5 = QRect::width((QRect *)in_stack_fffffffffffffd38);
      iVar5 = iVar2 - iVar5;
      QString::~QString((QString *)0x51eea2);
      QWidget::fontMetrics(in_stack_fffffffffffffd38);
      QFontMetrics::operator=
                ((QFontMetrics *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                 (QFontMetrics *)in_stack_fffffffffffffd38);
      QFontMetrics::~QFontMetrics(local_1f0);
      latin1 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                          CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
      QString::QString((QString *)CONCAT44(iVar5,iVar2),latin1);
      local_200 = QFontMetrics::boundingRect((QString *)&local_178);
      QRect::width((QRect *)in_stack_fffffffffffffd38);
      QString::~QString((QString *)0x51ef75);
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                   (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(int)in_stack_fffffffffffffd38);
      local_154 = local_220;
      QFontMetrics::~QFontMetrics((QFontMetrics *)&local_178);
    }
    local_b4 = local_25c * local_b4;
    local_224 = QSize::width((QSize *)0x51efc7);
    piVar8 = qMax<int>(&local_224,&local_b4);
    local_b4 = *piVar8;
    local_258 = local_b8 * local_258;
    local_b8 = QSize::height((QSize *)0x51f009);
    local_b8 = local_258 + local_b8;
    QWidget::contentsMargins((QWidget *)in_stack_fffffffffffffd58);
    iVar2 = QMargins::left((QMargins *)0x51f05d);
    iVar5 = QMargins::right((QMargins *)0x51f06e);
    local_b4 = iVar2 + iVar5 + local_b4;
    iVar2 = QMargins::top((QMargins *)0x51f091);
    iVar5 = QMargins::bottom((QMargins *)0x51f0a2);
    local_b8 = iVar2 + iVar5 + local_b8;
    QSize::QSize((QSize *)CONCAT44(local_258,in_stack_fffffffffffffd40),
                 (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(int)in_stack_fffffffffffffd38);
    pQVar6->cachedSizeHint = local_23c;
    local_b0 = pQVar6->cachedSizeHint;
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_120);
    QStyleOption::~QStyleOption((QStyleOption *)CONCAT44(local_258,in_stack_fffffffffffffd40));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_b0;
}

Assistant:

QSize QCalendarWidget::minimumSizeHint() const
{
    Q_D(const QCalendarWidget);
    if (d->cachedSizeHint.isValid())
        return d->cachedSizeHint;

    ensurePolished();

    int w = 0;
    int h = 0;

    int end = 53;
    int rows = 7;
    int cols = 8;

    QStyleOption option;
    option.initFrom(this);
    const int marginH = (style()->pixelMetric(QStyle::PM_FocusFrameHMargin, &option, this) + 1) * 2;

    if (horizontalHeaderFormat() == QCalendarWidget::NoHorizontalHeader) {
        rows = 6;
    } else {
        for (int i = 1; i <= 7; i++) {
            QFontMetrics fm(d->m_model->formatForCell(0, i).font());
            w = qMax(w, fm.horizontalAdvance(d->m_model->dayName(d->m_model->dayOfWeekForColumn(i))) + marginH);
            h = qMax(h, fm.height());
        }
    }

    if (verticalHeaderFormat() == QCalendarWidget::NoVerticalHeader) {
        cols = 7;
    } else {
        for (int i = 1; i <= 6; i++) {
            QFontMetrics fm(d->m_model->formatForCell(i, 0).font());
            for (int j = 1; j < end; j++)
                w = qMax(w, fm.horizontalAdvance(QString::number(j)) + marginH);
            h = qMax(h, fm.height());
        }
    }

    QFontMetrics fm(d->m_model->formatForCell(1, 1).font());
    for (int i = 1; i <= end; i++) {
        w = qMax(w, fm.horizontalAdvance(QString::number(i)) + marginH);
        h = qMax(h, fm.height());
    }

    if (d->m_view->showGrid()) {
        // hardcoded in tableview
        w += 1;
        h += 1;
    }

    w += 1; // default column span

    h = qMax(h, d->m_view->verticalHeader()->minimumSectionSize());
    w = qMax(w, d->m_view->horizontalHeader()->minimumSectionSize());

    //add the size of the header.
    QSize headerSize(0, 0);
    if (d->navBarVisible) {
        int headerH = d->navBarBackground->sizeHint().height();
        int headerW = 0;

        headerW += d->prevMonth->sizeHint().width();
        headerW += d->nextMonth->sizeHint().width();

        QFontMetrics fm = d->monthButton->fontMetrics();
        int monthW = 0;
        for (int i = 1; i < 12; i++) {
            QString monthName = d->m_model->monthName(locale(), i);
            monthW = qMax(monthW, fm.boundingRect(monthName).width());
        }
        const int buttonDecoMargin = d->monthButton->sizeHint().width() - fm.boundingRect(d->monthButton->text()).width();
        headerW += monthW + buttonDecoMargin;

        fm = d->yearButton->fontMetrics();
        headerW += fm.boundingRect("5555"_L1).width() + buttonDecoMargin;

        headerSize = QSize(headerW, headerH);
    }
    w *= cols;
    w = qMax(headerSize.width(), w);
    h = (h * rows) + headerSize.height();
    QMargins cm = contentsMargins();
    w += cm.left() + cm.right();
    h += cm.top() + cm.bottom();
    d->cachedSizeHint = QSize(w, h);
    return d->cachedSizeHint;
}